

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator
fmt::v10::detail::write_escaped_cp<fmt::v10::detail::counting_iterator,char>
          (counting_iterator out,find_escape_result<char> *escape)

{
  uint cp;
  char *pcVar1;
  counting_iterator cVar2;
  type tVar3;
  type tVar4;
  
  cp = escape->cp;
  if ((((ulong)cp < 0x28) && ((0x8400002600U >> ((ulong)cp & 0x3f) & 1) != 0)) || (cp == 0x5c)) {
    out.count_ = out.count_ + 2;
  }
  else {
    if (cp < 0x100) {
      cVar2 = write_codepoint<2ul,char,fmt::v10::detail::counting_iterator>(out,'x',cp);
      return (counting_iterator)cVar2.count_;
    }
    if (cp < 0x10000) {
      cVar2 = write_codepoint<4ul,char,fmt::v10::detail::counting_iterator>(out,'u',cp);
      return (counting_iterator)cVar2.count_;
    }
    if (cp < 0x110000) {
      cVar2 = write_codepoint<8ul,char,fmt::v10::detail::counting_iterator>(out,'U',cp);
      return (counting_iterator)cVar2.count_;
    }
    pcVar1 = escape->begin;
    tVar3 = to_unsigned<long>((long)escape->end - (long)pcVar1);
    for (tVar4 = 0; tVar3 != tVar4; tVar4 = tVar4 + 1) {
      out = write_codepoint<2ul,char,fmt::v10::detail::counting_iterator>
                      (out,'x',(uint)(byte)pcVar1[tVar4]);
    }
  }
  return (counting_iterator)out.count_;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (escape.cp < 0x100) {
      return write_codepoint<2, Char>(out, 'x', escape.cp);
    }
    if (escape.cp < 0x10000) {
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    }
    if (escape.cp < 0x110000) {
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}